

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void iDynTree::assertWoAbort(char *semCheck,char *file,char *func,int line)

{
  ostream *poVar1;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RSI);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ECX);
  poVar1 = std::operator<<(poVar1,": Failed assertion \'");
  poVar1 = std::operator<<(poVar1,in_RDI);
  std::operator<<(poVar1,"\'.\n");
  return;
}

Assistant:

void assertWoAbort(const char* semCheck, const char* file, const char* func, int line)
    {
        std::cerr << file << ": " << func << ": " << line << ": Failed assertion '" << semCheck << "'.\n";
    }